

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::type_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *type,uint32_t id)

{
  uint32_t uVar1;
  size_type sVar2;
  char *pcVar3;
  CompilerError *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  uint *in_R9;
  allocator local_a1;
  char *local_a0;
  char *local_98;
  char *local_90;
  allocator local_81;
  char *local_80;
  char *local_78;
  char *local_70;
  allocator local_67;
  allocator local_66;
  allocator local_65;
  allocator local_64;
  allocator local_63;
  allocator local_62;
  allocator local_61;
  allocator local_60;
  allocator local_5f;
  allocator local_5e;
  allocator local_5d;
  allocator local_5c;
  allocator local_5b;
  allocator local_5a;
  allocator local_59;
  allocator local_58;
  allocator local_57;
  allocator local_56;
  allocator local_55 [13];
  string local_48 [36];
  uint32_t local_24;
  SPIRType *pSStack_20;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerHLSL *this_local;
  
  local_24 = id;
  pSStack_20 = type;
  type_local = (SPIRType *)this;
  this_local = (CompilerHLSL *)__return_storage_ptr__;
  switch(type->basetype) {
  case Void:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"void",&local_56);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_56);
    break;
  default:
    if ((type->vecsize == 1) && (type->columns == 1)) {
      switch(type->basetype) {
      case Boolean:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"bool",&local_57);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_57);
        break;
      default:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"???",&local_67);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_67);
        break;
      case Short:
        if (((this->hlsl_options).enable_16bit_types & 1U) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"min16int",&local_5e);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_5e);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"int16_t",&local_5d);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_5d);
        }
        break;
      case UShort:
        if (((this->hlsl_options).enable_16bit_types & 1U) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"min16uint",&local_60);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_60);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"uint16_t",&local_5f);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_5f);
        }
        break;
      case Int:
        pcVar3 = (this->super_CompilerGLSL).backend.basic_int_type;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_58);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_58);
        break;
      case UInt:
        pcVar3 = (this->super_CompilerGLSL).backend.basic_uint_type;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_59);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
        break;
      case Int64:
        if ((this->hlsl_options).shader_model < 0x3c) {
          pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar4,"64-bit integers only supported in SM 6.0.");
          __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"int64_t",&local_63);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_63);
        break;
      case UInt64:
        if ((this->hlsl_options).shader_model < 0x3c) {
          pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar4,"64-bit integers only supported in SM 6.0.");
          __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"uint64_t",&local_64);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_64);
        break;
      case AtomicCounter:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"atomic_uint",&local_5a);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_5a);
        break;
      case Half:
        if (((this->hlsl_options).enable_16bit_types & 1U) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"min16float",&local_5c);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_5c);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"half",&local_5b);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_5b);
        }
        break;
      case Float:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"float",&local_61);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
        break;
      case Double:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"double",&local_62);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_62);
        break;
      case AccelerationStructure:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"RaytracingAccelerationStructure",&local_65);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_65);
        break;
      case RayQuery:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"RayQuery<RAY_FLAG_NONE>",&local_66);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_66);
      }
    }
    else if ((type->vecsize < 2) || (type->columns != 1)) {
      switch(type->basetype) {
      case Boolean:
        join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)"bool",(char (*) [5])&type->columns,
                   (uint *)0x5abb75,(char (*) [2])&type->vecsize,in_R9);
        break;
      default:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"???",&local_a1);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        break;
      case Short:
        local_98 = "min16int";
        if (((this->hlsl_options).enable_16bit_types & 1U) != 0) {
          local_98 = "int16_t";
        }
        join<char_const*,unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)&local_98,(char **)&type->columns,
                   (uint *)0x5abb75,(char (*) [2])&type->vecsize,in_R9);
        break;
      case UShort:
        local_a0 = "min16uint";
        if (((this->hlsl_options).enable_16bit_types & 1U) != 0) {
          local_a0 = "uint16_t";
        }
        join<char_const*,unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)&local_a0,(char **)&type->columns,
                   (uint *)0x5abb75,(char (*) [2])&type->vecsize,in_R9);
        break;
      case Int:
        join<char_const(&)[4],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)0x57f9f8,(char (*) [4])&type->columns,
                   (uint *)0x5abb75,(char (*) [2])&type->vecsize,in_R9);
        break;
      case UInt:
        join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)0x5a0677,(char (*) [5])&type->columns,
                   (uint *)0x5abb75,(char (*) [2])&type->vecsize,in_R9);
        break;
      case Half:
        local_90 = "min16float";
        if (((this->hlsl_options).enable_16bit_types & 1U) != 0) {
          local_90 = "half";
        }
        join<char_const*,unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)&local_90,(char **)&type->columns,
                   (uint *)0x5abb75,(char (*) [2])&type->vecsize,in_R9);
        break;
      case Float:
        join<char_const(&)[6],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)0x5993e0,(char (*) [6])&type->columns,
                   (uint *)0x5abb75,(char (*) [2])&type->vecsize,in_R9);
        break;
      case Double:
        join<char_const(&)[7],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)0x597f13,(char (*) [7])&type->columns,
                   (uint *)0x5abb75,(char (*) [2])&type->vecsize,in_R9);
      }
    }
    else {
      switch(type->basetype) {
      case Boolean:
        join<char_const(&)[5],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)"bool",(char (*) [5])&type->vecsize,
                   &switchD_002c33a6::switchdataD_00594a04);
        break;
      default:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"???",&local_81);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
        break;
      case Short:
        local_78 = "min16int";
        if (((this->hlsl_options).enable_16bit_types & 1U) != 0) {
          local_78 = "int16_t";
        }
        join<char_const*,unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)&local_78,(char **)&type->vecsize,
                   (uint *)0x5946f7);
        break;
      case UShort:
        local_80 = "min16uint";
        if (((this->hlsl_options).enable_16bit_types & 1U) != 0) {
          local_80 = "uint16_t";
        }
        join<char_const*,unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)&local_80,(char **)&type->vecsize,
                   (uint *)"uint16_t");
        break;
      case Int:
        join<char_const(&)[4],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)0x57f9f8,(char (*) [4])&type->vecsize,
                   &switchD_002c33a6::switchdataD_00594a04);
        break;
      case UInt:
        join<char_const(&)[5],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)0x5a0677,(char (*) [5])&type->vecsize,
                   &switchD_002c33a6::switchdataD_00594a04);
        break;
      case Int64:
        join<char_const(&)[7],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)"i64vec",(char (*) [7])&type->vecsize,
                   &switchD_002c33a6::switchdataD_00594a04);
        break;
      case UInt64:
        join<char_const(&)[7],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)"u64vec",(char (*) [7])&type->vecsize,
                   &switchD_002c33a6::switchdataD_00594a04);
        break;
      case Half:
        local_70 = "min16float";
        if (((this->hlsl_options).enable_16bit_types & 1U) != 0) {
          local_70 = "half";
        }
        join<char_const*,unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)&local_70,(char **)&type->vecsize,
                   (uint *)0x58ab42);
        break;
      case Float:
        join<char_const(&)[6],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)0x5993e0,(char (*) [6])&type->vecsize,
                   &switchD_002c33a6::switchdataD_00594a04);
        break;
      case Double:
        join<char_const(&)[7],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)0x597f13,(char (*) [7])&type->vecsize,
                   &switchD_002c33a6::switchdataD_00594a04);
      }
    }
    break;
  case Struct:
    if (((this->super_CompilerGLSL).backend.explicit_struct_type & 1U) == 0) {
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (__return_storage_ptr__,this,(ulong)uVar1,1);
    }
    else {
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_48,this,(ulong)uVar1);
      join<char_const(&)[8],std::__cxx11::string>
                (__return_storage_ptr__,(spirv_cross *)0x56c4b2,(char (*) [8])local_48,ts_1);
      ::std::__cxx11::string::~string(local_48);
    }
    break;
  case Image:
  case SampledImage:
    image_type_hlsl_abi_cxx11_(__return_storage_ptr__,this,type,id);
    break;
  case Sampler:
    sVar2 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.comparison_ids,&local_24);
    pcVar3 = "SamplerState";
    if (sVar2 != 0) {
      pcVar3 = "SamplerComparisonState";
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,local_55);
    ::std::allocator<char>::~allocator((allocator<char> *)local_55);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::type_to_glsl(const SPIRType &type, uint32_t id)
{
	// Ignore the pointer type since GLSL doesn't have pointers.

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		if (backend.explicit_struct_type)
			return join("struct ", to_name(type.self));
		else
			return to_name(type.self);

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_hlsl(type, id);

	case SPIRType::Sampler:
		return comparison_ids.count(id) ? "SamplerComparisonState" : "SamplerState";

	case SPIRType::Void:
		return "void";

	default:
		break;
	}

	if (type.vecsize == 1 && type.columns == 1) // Scalar builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return "bool";
		case SPIRType::Int:
			return backend.basic_int_type;
		case SPIRType::UInt:
			return backend.basic_uint_type;
		case SPIRType::AtomicCounter:
			return "atomic_uint";
		case SPIRType::Half:
			if (hlsl_options.enable_16bit_types)
				return "half";
			else
				return "min16float";
		case SPIRType::Short:
			if (hlsl_options.enable_16bit_types)
				return "int16_t";
			else
				return "min16int";
		case SPIRType::UShort:
			if (hlsl_options.enable_16bit_types)
				return "uint16_t";
			else
				return "min16uint";
		case SPIRType::Float:
			return "float";
		case SPIRType::Double:
			return "double";
		case SPIRType::Int64:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("64-bit integers only supported in SM 6.0.");
			return "int64_t";
		case SPIRType::UInt64:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("64-bit integers only supported in SM 6.0.");
			return "uint64_t";
		case SPIRType::AccelerationStructure:
			return "RaytracingAccelerationStructure";
		case SPIRType::RayQuery:
			return "RayQuery<RAY_FLAG_NONE>";
		default:
			return "???";
		}
	}
	else if (type.vecsize > 1 && type.columns == 1) // Vector builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bool", type.vecsize);
		case SPIRType::Int:
			return join("int", type.vecsize);
		case SPIRType::UInt:
			return join("uint", type.vecsize);
		case SPIRType::Half:
			return join(hlsl_options.enable_16bit_types ? "half" : "min16float", type.vecsize);
		case SPIRType::Short:
			return join(hlsl_options.enable_16bit_types ? "int16_t" : "min16int", type.vecsize);
		case SPIRType::UShort:
			return join(hlsl_options.enable_16bit_types ? "uint16_t" : "min16uint", type.vecsize);
		case SPIRType::Float:
			return join("float", type.vecsize);
		case SPIRType::Double:
			return join("double", type.vecsize);
		case SPIRType::Int64:
			return join("i64vec", type.vecsize);
		case SPIRType::UInt64:
			return join("u64vec", type.vecsize);
		default:
			return "???";
		}
	}
	else
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bool", type.columns, "x", type.vecsize);
		case SPIRType::Int:
			return join("int", type.columns, "x", type.vecsize);
		case SPIRType::UInt:
			return join("uint", type.columns, "x", type.vecsize);
		case SPIRType::Half:
			return join(hlsl_options.enable_16bit_types ? "half" : "min16float", type.columns, "x", type.vecsize);
		case SPIRType::Short:
			return join(hlsl_options.enable_16bit_types ? "int16_t" : "min16int", type.columns, "x", type.vecsize);
		case SPIRType::UShort:
			return join(hlsl_options.enable_16bit_types ? "uint16_t" : "min16uint", type.columns, "x", type.vecsize);
		case SPIRType::Float:
			return join("float", type.columns, "x", type.vecsize);
		case SPIRType::Double:
			return join("double", type.columns, "x", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
}